

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
double_writer::operator()
          (double_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  char *end;
  double_writer local_38;
  undefined7 uStack_37;
  char *pcStack_30;
  ostream_type *local_28;
  char *pcStack_20;
  
  if (this[8] != (double_writer)0x0) {
    local_38 = this[8];
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(it,(char *)&local_38);
    *(long *)this = *(long *)this + -1;
  }
  end = *(char **)(*(long *)(this + 0x10) + 8);
  local_28 = it->_M_stream;
  pcStack_20 = it->_M_string;
  internal::copy_str<char,char*,std::ostream_iterator<char,char,std::char_traits<char>>>
            ((char *)&local_38,end,
             (ostream_iterator<char,_char,_std::char_traits<char>_> *)
             (end + *(long *)(*(long *)(this + 0x10) + 0x10)));
  it->_M_stream = (ostream_type *)CONCAT71(uStack_37,local_38);
  it->_M_string = pcStack_30;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }